

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_HandleUnknownOption_Test::TestBody::TestSolver::~TestSolver(TestSolver *this)

{
  Solver *in_RDI;
  
  (in_RDI->super_BasicSolver).super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__TestSolver_00399ef8;
  (in_RDI->super_BasicSolver).super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__TestSolver_00399f68;
  (in_RDI->super_BasicSolver).super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__TestSolver_00399f90;
  (in_RDI->super_BasicSolver).super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__TestSolver_00399fc0;
  (in_RDI->super_BasicSolver).super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__TestSolver_00399fe0;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  mp::Solver::~Solver(in_RDI);
  return;
}

Assistant:

TEST(SolverTest, HandleUnknownOption) {
  struct TestSolver : Solver {
    std::string option_name;
    TestSolver() : Solver("test", 0, 0, 0) {}
    int DoSolve(Problem &, SolutionHandler &) { return 0; }
    void ReadNL(fmt::StringRef) {}
    void HandleUnknownOption(const char *name) { option_name = name; }
  };
  TestSolver s;
  s.ParseOptions(Args("BadOption"));
  EXPECT_EQ("BadOption", s.option_name);
}